

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  const_iterator cVar5;
  pointer pcVar6;
  ulong uVar7;
  iterator piter;
  const_iterator local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  iterator local_70;
  
  sVar3 = root_name_length(this);
  sVar4 = root_name_length(this);
  uVar2 = (this->_path)._M_string_length;
  if (sVar4 < uVar2) {
    uVar7 = (ulong)((this->_path)._M_dataplus._M_p[sVar4] == '/');
  }
  else {
    uVar7 = 0;
  }
  if (uVar7 + sVar3 < uVar2) {
    local_90._M_current = (this->_path)._M_dataplus._M_p + uVar2;
    iterator::iterator(&local_70,this,&local_90);
    local_90._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    cVar5 = iterator::decrement(&local_70,&local_90);
    pcVar6 = (this->_path)._M_dataplus._M_p;
    if (pcVar6 + uVar7 + sVar3 < cVar5._M_current) {
      cVar5._M_current = cVar5._M_current + -(ulong)(*cVar5._M_current != '/');
    }
    local_90._M_current = &local_80;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_90,pcVar6,cVar5._M_current);
    paVar1 = &(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
    if (local_90._M_current == &local_80) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_7f,local_80);
      *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_78;
    }
    else {
      (__return_storage_ptr__->_path)._M_dataplus._M_p = local_90._M_current;
      (__return_storage_ptr__->_path).field_2._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    }
    (__return_storage_ptr__->_path)._M_string_length = local_88;
    local_88 = 0;
    local_80 = '\0';
    local_90._M_current = &local_80;
    postprocess_path_with_format(__return_storage_ptr__,(format)pcVar6);
    if (local_90._M_current != &local_80) {
      operator_delete(local_90._M_current);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
      operator_delete(local_70._current._path._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    pcVar6 = (this->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar6,pcVar6 + uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}